

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thumb_instr.c
# Opt level: O1

thumb_instr_type_t get_thumb_instr_type_hash(uint16_t hash)

{
  thumb_instr_type_t tVar1;
  ushort uVar2;
  thumb_instr_type_t tVar3;
  thumb_instr_type_t tVar4;
  thumb_instr_type_t tVar5;
  
  tVar5 = (thumb_instr_type_t)hash;
  tVar3 = tVar5 & 0x3e0;
  tVar1 = ADD_SUBTRACT;
  if (tVar3 != 0x60) {
    tVar4 = tVar5 & 0x380;
    if ((hash & 0x380) == 0) {
      return tVar4;
    }
    if (tVar4 == 0x80) {
      return IMMEDIATE_OPERATIONS;
    }
    if ((tVar5 & 0x3f0) == 0x100) {
      return ALU_OPERATIONS;
    }
    if ((tVar5 & 0x3f0) == 0x110) {
      uVar2 = hash >> 2 & 3;
      tVar1 = THUMB_UNDEFINED;
      if (uVar2 == 3 || (hash & 3) != 0) {
        tVar1 = THUMB_UNDEFINED;
        if ((hash & 2) == 0) {
          tVar1 = HIGH_REGISTER_OPERATIONS;
        }
        if (uVar2 != 3) {
          tVar1 = HIGH_REGISTER_OPERATIONS;
        }
        return tVar1;
      }
    }
    else {
      tVar1 = PC_RELATIVE_LOAD;
      if (tVar3 != 0x120) {
        if ((tVar5 & 0x3c8) == 0x140) {
          return LOAD_STORE_RO;
        }
        if ((tVar5 & 0x3c8) == 0x148) {
          return LOAD_STORE_BYTE_HALFWORD;
        }
        tVar1 = LOAD_STORE_IO;
        if (tVar4 != 0x180) {
          tVar4 = tVar5 & 0x3c0;
          if (tVar4 == 0x200) {
            return LOAD_STORE_HALFWORD;
          }
          if (tVar4 == 0x280) {
            return LOAD_ADDRESS;
          }
          if (tVar4 == 0x240) {
            return SP_RELATIVE_LOAD_STORE;
          }
          tVar1 = ADD_OFFSET_TO_STACK_POINTER;
          if (((((tVar5 & 0x3fc) != 0x2c0) && (tVar1 = PUSH_POP_REGISTERS, (tVar5 & 0x3d8) != 0x2d0)
               ) && (tVar1 = MULTIPLE_LOAD_STORE, tVar4 != 0x300)) &&
             (tVar1 = THUMB_SOFTWARE_INTERRUPT, (tVar5 & 0x3fc) != 0x37c)) {
            if (tVar4 == 0x340) {
              return (uint)((~tVar5 & 0x38) == 0) * 4 + CONDITIONAL_BRANCH;
            }
            tVar1 = UNCONDITIONAL_BRANCH;
            if (tVar3 != 0x380) {
              return tVar4 == 0x3c0 ^ THUMB_UNDEFINED;
            }
          }
        }
      }
    }
  }
  return tVar1;
}

Assistant:

thumb_instr_type_t get_thumb_instr_type_hash(half hash) {
    if ((hash & 0b1111100000u) == 0b0001100000u) {
        return ADD_SUBTRACT;
    }
    if ((hash & 0b1110000000u) == 0b0000000000u) {
        return MOVE_SHIFTED_REGISTER;
    }
    if ((hash & 0b1110000000u) == 0b0010000000u) {
        return IMMEDIATE_OPERATIONS;
    }
    if ((hash & 0b1111110000u) == 0b0100000000u) {
        return ALU_OPERATIONS;
    }
    if ((hash & 0b1111110000u) == 0b0100010000u) {
        bool h1 = (hash >> 1u) & 1u;
        bool h2 = hash & 1u;
        byte opcode = (hash >> 2u) & 0b11u;

        if (opcode != 0b11 && h1 == 0 && h2 == 0) return THUMB_UNDEFINED;
        if (opcode == 0b11 && h1 == 1) return THUMB_UNDEFINED;

        return HIGH_REGISTER_OPERATIONS;
    }
    if ((hash & 0b1111100000u) == 0b0100100000u) return PC_RELATIVE_LOAD;
    if ((hash & 0b1111001000u) == 0b0101000000u) return LOAD_STORE_RO;
    if ((hash & 0b1111001000u) == 0b0101001000u) return LOAD_STORE_BYTE_HALFWORD;
    if ((hash & 0b1110000000u) == 0b0110000000u) return LOAD_STORE_IO;
    if ((hash & 0b1111000000u) == 0b1000000000u) return LOAD_STORE_HALFWORD;
    if ((hash & 0b1111000000u) == 0b1001000000u) return SP_RELATIVE_LOAD_STORE;
    if ((hash & 0b1111000000u) == 0b1010000000u) return LOAD_ADDRESS;
    if ((hash & 0b1111111100u) == 0b1011000000u) return ADD_OFFSET_TO_STACK_POINTER;
    if ((hash & 0b1111011000u) == 0b1011010000u) return PUSH_POP_REGISTERS;
    if ((hash & 0b1111000000u) == 0b1100000000u) return MULTIPLE_LOAD_STORE;
    if ((hash & 0b1111111100u) == 0b1101111100u) return THUMB_SOFTWARE_INTERRUPT;
    if ((hash & 0b1111000000u) == 0b1101000000u) {
        if (((hash >> 3u) & 0b111u) == 0b111u) {
            return THUMB_UNDEFINED;
        }

        return CONDITIONAL_BRANCH;
    }
    if ((hash & 0b1111100000u) == 0b1110000000u) return UNCONDITIONAL_BRANCH;
    if ((hash & 0b1111000000u) == 0b1111000000u) return LONG_BRANCH_LINK;

    return THUMB_UNDEFINED;
}